

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O3

int hugeRead(void *context,char *buffer,int len)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar3 = curseg;
  pcVar2 = current;
  iVar1 = rlen;
  iVar4 = -1;
  if (-1 < len && (buffer != (char *)0x0 && context != (void *)0x0)) {
    iVar5 = rlen - len;
    if (iVar5 == 0 || rlen < len) {
      rlen = 0;
      iVar4 = 0;
      if (curseg < 0xf4241) {
        memcpy(buffer,current,(long)iVar1);
        curseg = iVar3 + 1;
        iVar4 = iVar1;
        if (curseg == 1000000) {
          fputc(10,_stderr);
          rlen = 6;
          current = "</foo>";
        }
        else {
          if ((curseg * 0xbcbe61d + 0xa7c40U >> 5 | curseg * -0x18000000) < 0xa7c5) {
            fputc(0x2e,_stderr);
          }
          rlen = 0x19;
          current = "  <bar>&e; &f; &d;</bar>\n";
        }
      }
    }
    else {
      memcpy(buffer,current,(ulong)(uint)len);
      current = pcVar2 + (uint)len;
      iVar4 = len;
      rlen = iVar5;
    }
  }
  return iVar4;
}

Assistant:

static int
hugeRead(void *context, char *buffer, int len)
{
    if ((context == NULL) || (buffer == NULL) || (len < 0))
        return (-1);

    if (len >= rlen) {
        if (curseg >= MAX_NODES + 1) {
            rlen = 0;
            return(0);
        }
        len = rlen;
        rlen = 0;
	memcpy(buffer, current, len);
        curseg ++;
        if (curseg == MAX_NODES) {
	    fprintf(stderr, "\n");
            rlen = strlen(finish);
            current = finish;
	} else {
	    if (curseg % (MAX_NODES / 10) == 0)
	        fprintf(stderr, ".");
            rlen = strlen(segment);
            current = segment;
	}
    } else {
	memcpy(buffer, current, len);
	rlen -= len;
        current += len;
    }
    return (len);
}